

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O2

char ** cmsysSystem_Parse_CommandForUnix(char *command,int flags)

{
  byte c;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ushort **ppuVar5;
  char **__dest;
  ulong uVar6;
  bool bVar7;
  char **ppcVar8;
  char **__src;
  size_t __n;
  int buffer_size;
  char *buffer_begin;
  char *local_558;
  int pointers_size;
  char **local_548;
  char **pointer_begin;
  char *local_pointers [32];
  char local_buffer [1024];
  
  bVar7 = false;
  if (flags != 0) {
    return (char **)0x0;
  }
  pointers_size = 0x20;
  local_548 = local_pointers;
  buffer_size = 0x400;
  buffer_begin = local_buffer;
  bVar1 = false;
  bVar3 = false;
  bVar2 = false;
  local_558 = buffer_begin;
  pointer_begin = local_548;
  while( true ) {
    c = *command;
    uVar6 = (ulong)c;
    if (uVar6 == 0) break;
    if (bVar1) {
LAB_0012279e:
      iVar4 = kwsysSystem__AppendByte(local_buffer,&buffer_begin,&local_558,&buffer_size,c);
      if (iVar4 == 0) goto LAB_00122876;
      bVar1 = false;
      bVar7 = true;
    }
    else if (c == 0x5c) {
      bVar1 = true;
    }
    else if ((c != 0x27) || (bVar2)) {
      if (bVar3 || c != 0x22) {
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + uVar6 * 2 + 1) & 0x20) == 0) goto LAB_0012279e;
        bVar1 = false;
        if (bVar7) {
          if (!bVar3 && !bVar2) {
            iVar4 = kwsysSystem__AppendArgument
                              (local_pointers,&pointer_begin,&local_548,&pointers_size,local_buffer,
                               &buffer_begin,&local_558,&buffer_size);
            if (iVar4 != 0) {
              bVar7 = false;
              bVar3 = false;
              goto LAB_0012277a;
            }
            goto LAB_00122876;
          }
          iVar4 = kwsysSystem__AppendByte(local_buffer,&buffer_begin,&local_558,&buffer_size,c);
          bVar7 = true;
          if (iVar4 == 0) goto LAB_00122876;
        }
        else {
          bVar7 = false;
        }
      }
      else {
        bVar2 = !bVar2;
        if (bVar2) {
          bVar7 = true;
        }
        bVar1 = false;
        bVar3 = false;
      }
    }
    else {
      bVar3 = !bVar3;
      if (bVar3) {
        bVar7 = true;
      }
LAB_0012277a:
      bVar1 = false;
      bVar2 = false;
    }
    command = (char *)((byte *)command + 1);
  }
  if (bVar7) {
LAB_00122876:
    iVar4 = kwsysSystem__AppendArgument
                      (local_pointers,&pointer_begin,&local_548,&pointers_size,local_buffer,
                       &buffer_begin,&local_558,&buffer_size);
    ppcVar8 = local_548;
    __src = pointer_begin;
    if ((uVar6 == 0) && (iVar4 != 0)) goto LAB_001228cc;
  }
  else {
LAB_001228cc:
    __src = pointer_begin;
    ppcVar8 = local_548;
    __n = (long)local_548 - (long)pointer_begin;
    __dest = (char **)malloc(__n + 8);
    if (__dest != (char **)0x0) {
      memcpy(__dest,__src,__n);
      *(undefined8 *)((long)__dest + __n) = 0;
      goto LAB_001228f7;
    }
  }
  __dest = (char **)0x0;
  for (; ppcVar8 != __src; ppcVar8 = ppcVar8 + -1) {
    free(ppcVar8[-1]);
  }
LAB_001228f7:
  if (__src != local_pointers) {
    free(__src);
  }
  if (buffer_begin != local_buffer) {
    free(buffer_begin);
  }
  return __dest;
}

Assistant:

char** kwsysSystem_Parse_CommandForUnix(const char* command, int flags)
{
  /* Validate the flags.  */
  if (flags != 0) {
    return 0;
  }

  /* Forward to our internal implementation.  */
  return kwsysSystem__ParseUnixCommand(command, flags);
}